

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcSymObjBase::delete_vocab_prop(CTcSymObjBase *this,tctarg_prop_id_t prop)

{
  CTcVocabEntry *pCVar1;
  CTcVocabEntry *pCVar2;
  CTcVocabEntry *pCVar3;
  CTcVocabEntry *pCVar4;
  CTcVocabEntry **ppCVar5;
  
  if (this->vocab_ != (CTcVocabEntry *)0x0) {
    pCVar2 = this->vocab_;
    pCVar3 = (CTcVocabEntry *)0x0;
    do {
      pCVar1 = pCVar2->nxt_;
      pCVar4 = pCVar2;
      if (pCVar2->prop_ == prop) {
        ppCVar5 = &pCVar3->nxt_;
        if (pCVar3 == (CTcVocabEntry *)0x0) {
          ppCVar5 = &this->vocab_;
        }
        *ppCVar5 = pCVar1;
        pCVar2->nxt_ = (CTcVocabEntry *)0x0;
        pCVar4 = pCVar3;
      }
      pCVar2 = pCVar1;
      pCVar3 = pCVar4;
    } while (pCVar1 != (CTcVocabEntry *)0x0);
  }
  return;
}

Assistant:

void CTcSymObjBase::delete_vocab_prop(tctarg_prop_id_t prop)
{
    /* scan my list and delete each word defined for the given property */
    for (CTcVocabEntry *prv = 0, *entry = vocab_, *nxt = 0 ;
         entry != 0 ; entry = nxt)
    {
        /* remember the next entry */
        nxt = entry->nxt_;
        
        /* if this entry is for the given property, unlink it */
        if (entry->prop_ == prop)
        {
            /* 
             *   it matches - unlink it from the list (note that we don't
             *   have to delete the entry, because it's allocated in
             *   parser memory and thus will be deleted when the parser is
             *   deleted) 
             */
            if (prv != 0)
                prv->nxt_ = nxt;
            else
                vocab_ = nxt;

            /* 
             *   this entry is no longer in any list (we don't really have
             *   to clear the 'next' pointer here, since nothing points to
             *   'entry' any more, but doing so will make it obvious that
             *   the entry was removed from the list, which could be handy
             *   during debugging from time to time) 
             */
            entry->nxt_ = 0;
        }
        else
        {
            /* 
             *   this entry is still in the list, so it's now the previous
             *   entry for our scan 
             */
            prv = entry;
        }
    }
}